

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vshasigmaw_ppc64(ppc_avr_t *r,ppc_avr_t *a,uint32_t st_six)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint local_28;
  int i;
  int six;
  int st;
  uint32_t st_six_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    if ((st_six & 0x10) == 0) {
      if ((st_six & 0xf & 8 >> ((byte)local_28 & 0x1f)) == 0) {
        uVar1 = ror32(a->u32[(int)(3 - local_28)],7);
        uVar2 = ror32(a->u32[(int)(3 - local_28)],0x12);
        r->u32[(int)(3 - local_28)] = uVar1 ^ uVar2 ^ a->u32[(int)(3 - local_28)] >> 3;
      }
      else {
        uVar1 = ror32(a->u32[(int)(3 - local_28)],0x11);
        uVar2 = ror32(a->u32[(int)(3 - local_28)],0x13);
        r->u32[(int)(3 - local_28)] = uVar1 ^ uVar2 ^ a->u32[(int)(3 - local_28)] >> 10;
      }
    }
    else if ((st_six & 0xf & 8 >> ((byte)local_28 & 0x1f)) == 0) {
      uVar1 = ror32(a->u32[(int)(3 - local_28)],2);
      uVar2 = ror32(a->u32[(int)(3 - local_28)],0xd);
      uVar3 = ror32(a->u32[(int)(3 - local_28)],0x16);
      r->u32[(int)(3 - local_28)] = uVar1 ^ uVar2 ^ uVar3;
    }
    else {
      uVar1 = ror32(a->u32[(int)(3 - local_28)],6);
      uVar2 = ror32(a->u32[(int)(3 - local_28)],0xb);
      uVar3 = ror32(a->u32[(int)(3 - local_28)],0x19);
      r->u32[(int)(3 - local_28)] = uVar1 ^ uVar2 ^ uVar3;
    }
  }
  return;
}

Assistant:

void helper_vshasigmaw(ppc_avr_t *r,  ppc_avr_t *a, uint32_t st_six)
{
    int st = (st_six & 0x10) != 0;
    int six = st_six & 0xF;
    int i;

    for (i = 0; i < ARRAY_SIZE(r->u32); i++) {
        if (st == 0) {
            if ((six & (0x8 >> i)) == 0) {
                r->VsrW(i) = ror32(a->VsrW(i), 7) ^
                             ror32(a->VsrW(i), 18) ^
                             (a->VsrW(i) >> 3);
            } else { /* six.bit[i] == 1 */
                r->VsrW(i) = ror32(a->VsrW(i), 17) ^
                             ror32(a->VsrW(i), 19) ^
                             (a->VsrW(i) >> 10);
            }
        } else { /* st == 1 */
            if ((six & (0x8 >> i)) == 0) {
                r->VsrW(i) = ror32(a->VsrW(i), 2) ^
                             ror32(a->VsrW(i), 13) ^
                             ror32(a->VsrW(i), 22);
            } else { /* six.bit[i] == 1 */
                r->VsrW(i) = ror32(a->VsrW(i), 6) ^
                             ror32(a->VsrW(i), 11) ^
                             ror32(a->VsrW(i), 25);
            }
        }
    }
}